

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

Status __thiscall
spvtools::opt::ConvertToSampledImagePass::UpdateImageVariableToSampledImage
          (ConvertToSampledImagePass *this,Instruction *image_variable,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  Instruction *sampled_image_load;
  pointer ppIVar1;
  pointer ppIVar2;
  bool bVar3;
  array<signed_char,_4UL> sampled_image_type_id;
  Instruction *image_extraction;
  Status SVar4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  image_variable_loads;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindUses(this,image_variable,&local_48,OpLoad);
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SVar4 = SuccessWithoutChange;
  }
  else {
    sampled_image_type_id._M_elems = (_Type)GetSampledImageTypeForImage(this,image_variable);
    ppIVar2 = local_48.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar1 = local_48.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (sampled_image_type_id._M_elems == (_Type)0x0) {
      SVar4 = Failure;
    }
    else {
      for (; ppIVar1 != ppIVar2; ppIVar1 = ppIVar1 + 1) {
        sampled_image_load = *ppIVar1;
        if (sampled_image_load->has_type_id_ == false) {
          __assert_fail("has_type_id_",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
        }
        local_70._0_8_ = &PTR__SmallVector_009488e0;
        local_70._24_8_ = local_70 + 0x10;
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_70._8_8_ = 1;
        local_70._16_4_ = sampled_image_type_id._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&((sampled_image_load->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start)->words,
                   (SmallVector<unsigned_int,_2UL> *)local_70);
        local_70._0_8_ = &PTR__SmallVector_009488e0;
        if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_50,local_50._M_head_impl);
        }
        image_extraction = UpdateImageUses(this,sampled_image_load);
        UpdateSampledImageUses(this,sampled_image_load,image_extraction,descriptor_set_binding);
      }
      bVar3 = ConvertImageVariableToSampledImage
                        (this,image_variable,(uint32_t)sampled_image_type_id._M_elems);
      SVar4 = (uint)bVar3 << 4;
    }
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return SVar4;
}

Assistant:

Pass::Status ConvertToSampledImagePass::UpdateImageVariableToSampledImage(
    Instruction* image_variable,
    const DescriptorSetAndBinding& descriptor_set_binding) {
  std::vector<Instruction*> image_variable_loads;
  FindUses(image_variable, &image_variable_loads, spv::Op::OpLoad);
  if (image_variable_loads.empty()) return Status::SuccessWithoutChange;

  const uint32_t sampled_image_type_id =
      GetSampledImageTypeForImage(image_variable);
  if (!sampled_image_type_id) return Status::Failure;

  for (auto* load : image_variable_loads) {
    load->SetResultType(sampled_image_type_id);
    auto* image_extraction = UpdateImageUses(load);
    UpdateSampledImageUses(load, image_extraction, descriptor_set_binding);
  }

  return ConvertImageVariableToSampledImage(image_variable,
                                            sampled_image_type_id)
             ? Status::SuccessWithChange
             : Status::Failure;
}